

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O1

void __thiscall
kj::
OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
::destroy(OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *this)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  
  if (this->tag == 1) {
    this->tag = 0;
    plVar1 = *(long **)((long)&this->field_1 + 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)&this->field_1 + 8) = 0;
      (**(code **)**(undefined8 **)&this->field_1)
                (*(undefined8 **)&this->field_1,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  if (this->tag == 2) {
    this->tag = 0;
    plVar1 = *(long **)((long)&this->field_1 + 8);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)&this->field_1 + 8) = 0;
      (**(code **)**(undefined8 **)&this->field_1)
                (*(undefined8 **)&this->field_1,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
  }
  if (this->tag == 3) {
    this->tag = 0;
    lVar2 = *(long *)((long)&this->field_1 + 8);
    if (lVar2 != 0) {
      uVar3 = *(undefined8 *)((long)&this->field_1 + 0x10);
      *(undefined8 *)((long)&this->field_1 + 8) = 0;
      *(undefined8 *)((long)&this->field_1 + 0x10) = 0;
      puVar4 = *(undefined8 **)((long)&this->field_1 + 0x18);
      (**(code **)*puVar4)(puVar4,lVar2,1,uVar3,uVar3,0);
    }
  }
  return;
}

Assistant:

void destroy() {
    doAll(destroyVariant<Variants>()...);
  }